

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISpriteBank::setTexture(CGUISpriteBank *this,u32 index,ITexture *texture)

{
  code *pcVar1;
  ITexture *pIVar2;
  _func_int *p_Var3;
  pointer ppIVar4;
  ITexture *local_30;
  
  ppIVar4 = (this->Textures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((uint)((ulong)((long)(this->Textures).m_data.
                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3) <=
      index) {
    do {
      local_30 = (ITexture *)0x0;
      ::std::vector<irr::video::ITexture*,std::allocator<irr::video::ITexture*>>::
      emplace_back<irr::video::ITexture*>
                ((vector<irr::video::ITexture*,std::allocator<irr::video::ITexture*>> *)
                 &this->Textures,&local_30);
      (this->Textures).is_sorted = false;
      ppIVar4 = (this->Textures).m_data.
                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while ((uint)((ulong)((long)(this->Textures).m_data.
                                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3)
             <= index);
  }
  if (texture != (ITexture *)0x0) {
    *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) =
         *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) + 1;
  }
  pIVar2 = ppIVar4[index];
  if (pIVar2 != (ITexture *)0x0) {
    p_Var3 = pIVar2->_vptr_ITexture[0xfffffffffffffffd];
    pcVar1 = p_Var3 + 8 + (long)&(pIVar2->NamedPath).Path;
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar2->_vptr_ITexture + (long)p_Var3) + 8))();
    }
  }
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start[index] = texture;
  return;
}

Assistant:

void CGUISpriteBank::setTexture(u32 index, video::ITexture *texture)
{
	while (index >= Textures.size())
		Textures.push_back(0);

	if (texture)
		texture->grab();

	if (Textures[index])
		Textures[index]->drop();

	Textures[index] = texture;
}